

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O1

bool test_Player_getDiceRoller(bool verbose)

{
  bool bVar1;
  bool bVar2;
  pointer piVar3;
  pointer piVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries;
  Hand *this;
  DiceRoller *this_00;
  Player *this_01;
  long lVar5;
  ostream_type *poVar6;
  bool bVar7;
  vector<int,_std::allocator<int>_> rolls;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  ownedCountries = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (Hand *)operator_new(8);
  Hand::Hand(this);
  this_00 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_00);
  this_01 = (Player *)operator_new(0x38);
  Player::Player(this_01,ownedCountries,this,this_00,1);
  DiceRoller::roll(&local_90,this_01->pDiceRoller,1);
  piVar4 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar3 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
LAB_001094da:
    bVar2 = false;
  }
  else {
    DiceRoller::roll(&local_60,this_01->pDiceRoller,2);
    if ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != 8) goto LAB_001094da;
    std::vector<int,_std::allocator<int>_>::vector(&local_78,this_01->pDiceRoller->history);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      DiceRoller::getPercentages(&local_48,this_01->pDiceRoller);
      bVar7 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
      bVar1 = true;
      bVar2 = true;
      goto LAB_001094e1;
    }
    bVar2 = true;
  }
  bVar1 = false;
  bVar7 = false;
LAB_001094e1:
  if ((bVar1) &&
     (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0)) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((bVar2) &&
     (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0)) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((piVar3 != piVar4) &&
     (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0)) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((ostream_type *)
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (ostream_type *)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[35m",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"player1 rolled ",0xf);
    DiceRoller::roll(&local_90,this_01->pDiceRoller,1);
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&std::cout;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    lVar5 = (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (0 < lVar5) {
      lVar5 = lVar5 + 1;
      poVar6 = (ostream_type *)
               local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=
                  ((ostream_iterator<int,_char,_std::char_traits<char>_> *)&local_a8,(int *)poVar6);
        poVar6 = poVar6 + 4;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"player1 rolled ",0xf);
    DiceRoller::roll(&local_a8,this_01->pDiceRoller,2);
    piVar4 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar3 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
    local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
    local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((ostream_type *)piVar3 != (ostream_type *)0x0) {
      operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    }
    if ((ostream_type *)
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (ostream_type *)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&std::cout;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    lVar5 = (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (0 < lVar5) {
      lVar5 = lVar5 + 1;
      poVar6 = (ostream_type *)
               local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=
                  ((ostream_iterator<int,_char,_std::char_traits<char>_> *)&local_a8,(int *)poVar6);
        poVar6 = poVar6 + 4;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"player1 rolled ",0xf);
    DiceRoller::roll(&local_a8,this_01->pDiceRoller,3);
    piVar4 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar3 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
    local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
    local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((ostream_type *)piVar3 != (ostream_type *)0x0) {
      operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    }
    if ((ostream_type *)
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (ostream_type *)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&std::cout;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    lVar5 = (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (0 < lVar5) {
      lVar5 = lVar5 + 1;
      poVar6 = (ostream_type *)
               local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=
                  ((ostream_iterator<int,_char,_std::char_traits<char>_> *)&local_a8,(int *)poVar6);
        poVar6 = poVar6 + 4;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m\n",6);
    if ((ostream_type *)
        local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (ostream_type *)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  Player::~Player(this_01);
  operator_delete(this_01,0x38);
  return bVar7;
}

Assistant:

bool test_Player_getDiceRoller(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    auto* cards = new Hand();
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 1);

    // Assert
    if (player1->getDiceRoller()->roll(1).empty()
        || player1->getDiceRoller()->roll(2).size() != 2
        || player1->getDiceRoller()->getHistory().empty()
        || player1->getDiceRoller()->getPercentages().empty()) {

        success = false;
    }

    if (verbose) {
        std::cout << "\n" << "\033[35m";
        std::cout << "player1 rolled ";
        std::vector<int> rolls = player1->getDiceRoller()->roll(1);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << std::endl;
        std::cout << "player1 rolled ";
        rolls = player1->getDiceRoller()->roll(2);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << std::endl;
        std::cout << "player1 rolled ";
        rolls = player1->getDiceRoller()->roll(3);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << "\033[31m\n";
    }
    delete player1;
    return success;
}